

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O0

void __thiscall Js::ProbeContainer::Initialize(ProbeContainer *this,ScriptContext *pScriptContext)

{
  ArenaAllocator *alloc;
  List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar1;
  ThreadContext *this_00;
  DebugManager *pDVar2;
  Recycler *alloc_00;
  List<const_Js::PropertyRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar3;
  ArenaAllocator *global;
  ScriptContext *pScriptContext_local;
  ProbeContainer *this_local;
  
  if (this->diagProbeList == (ProbeList *)0x0) {
    alloc = ScriptContext::AllocatorForDiagnostics(pScriptContext);
    pLVar1 = JsUtil::
             List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::New(alloc,4);
    this->diagProbeList = pLVar1;
    pLVar1 = JsUtil::
             List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::New(alloc,4);
    this->pendingProbeList = pLVar1;
    this->pScriptContext = pScriptContext;
    this_00 = ScriptContext::GetThreadContext(this->pScriptContext);
    pDVar2 = ThreadContext::GetDebugManager(this_00);
    this->debugManager = pDVar2;
    alloc_00 = ScriptContext::GetRecycler(this->pScriptContext);
    pLVar3 = JsUtil::
             List<const_Js::PropertyRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::New(alloc_00,4);
    this->pinnedPropertyRecords = pLVar3;
    ScriptContext::BindReference(this->pScriptContext,this->pinnedPropertyRecords);
  }
  return;
}

Assistant:

void ProbeContainer::Initialize(ScriptContext* pScriptContext)
    {
        if (!diagProbeList)
        {
            ArenaAllocator* global = pScriptContext->AllocatorForDiagnostics();

            diagProbeList = ProbeList::New(global);

            pendingProbeList = ProbeList::New(global);

            this->pScriptContext = pScriptContext;
            this->debugManager = this->pScriptContext->GetThreadContext()->GetDebugManager();
            this->pinnedPropertyRecords = JsUtil::List<const Js::PropertyRecord*>::New(this->pScriptContext->GetRecycler());
            this->pScriptContext->BindReference((void *)this->pinnedPropertyRecords);
        }
    }